

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O1

extent<pstore::repo::fragment>
(anonymous_namespace)::build_fragment<pstore::repo::section_content*>
          (transaction *transaction,section_content *begin,section_content *end)

{
  section_kind sVar1;
  section_creation_dispatcher *psVar2;
  uint64_t extraout_RDX;
  extent<pstore::repo::fragment> eVar3;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  fdata;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_68;
  not_null<const_pstore::repo::section_content_*> local_48;
  transaction *local_40;
  _Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false> local_38;
  
  if (-0xe0 < (long)end - (long)begin) {
    local_68.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)0x0;
    local_68.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)0x0;
    local_68.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)0x0;
    local_40 = transaction;
    if (begin != end) {
      do {
        psVar2 = (section_creation_dispatcher *)operator_new(0x18);
        sVar1 = begin->kind;
        local_48.ptr_ = begin;
        pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant(&local_48);
        psVar2->kind_ = sVar1;
        psVar2->_vptr_section_creation_dispatcher =
             (_func_int **)&PTR__section_creation_dispatcher_0019def8;
        psVar2[1]._vptr_section_creation_dispatcher = (_func_int **)local_48.ptr_;
        local_38._M_head_impl = psVar2;
        if (local_68.
            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
          ::_M_realloc_insert<pstore::repo::generic_section_creation_dispatcher*>
                    ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                      *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (generic_section_creation_dispatcher **)&local_38);
        }
        else {
          ((local_68.
            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
          super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>._M_head_impl =
               psVar2;
          local_68.
          super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        begin = begin + 1;
      } while (begin != end);
    }
    eVar3 = pstore::repo::fragment::
            alloc<transaction,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                      (local_40,(pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                                 )local_68.
                                  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                        )local_68.
                         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ::~vector(&local_68);
    eVar3.size = extraout_RDX;
    return eVar3;
  }
  pstore::assert_failed
            ("std::distance (begin, end) >= 0",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
             ,0x31);
}

Assistant:

TEST_F (FragmentTest, MakeReadOnlySection) {
    std::array<section_content, 1> c = {{{section_kind::read_only, std::uint8_t{4} /*alignment*/}}};
    section_content & rodata = c.back ();
    rodata.data.assign ({'r', 'o', 'd', 'a', 't', 'a'});
    auto extent = build_fragment (transaction_, std::begin (c), std::end (c));

    ASSERT_EQ (transaction_.get_storage ().begin ()->first,
               reinterpret_cast<std::uint8_t const *> (extent.addr.absolute ()));
    auto f = reinterpret_cast<fragment const *> (transaction_.get_storage ().begin ()->first);

    std::vector<section_kind> const expected{section_kind::read_only};
    auto const indices = f->members ().get_indices ();
    std::vector<section_kind> const actual{std::begin (indices), std::end (indices)};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));

    generic_section const & s = f->at<section_kind::read_only> ();

    EXPECT_EQ (4U, section_alignment (s));
    EXPECT_EQ (6U, section_size (s));

    auto data_begin = std::begin (s.payload ());
    auto data_end = std::end (s.payload ());
    auto rodata_begin = std::begin (rodata.data);
    auto rodata_end = std::end (rodata.data);
    ASSERT_EQ (std::distance (data_begin, data_end), std::distance (rodata_begin, rodata_end));
    EXPECT_TRUE (std::equal (data_begin, data_end, rodata_begin));
    EXPECT_EQ (4U, s.align ());
    EXPECT_EQ (0U, s.ifixups ().size ());
    EXPECT_EQ (0U, s.xfixups ().size ());
    EXPECT_EQ (f->atp<section_kind::linked_definitions> (), nullptr);
}